

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ReshapeLayerParams * __thiscall
CoreML::Specification::ReshapeLayerParams::New(ReshapeLayerParams *this,Arena *arena)

{
  ReshapeLayerParams *this_00;
  
  this_00 = (ReshapeLayerParams *)operator_new(0x30);
  ReshapeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReshapeLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReshapeLayerParams* ReshapeLayerParams::New(::google::protobuf::Arena* arena) const {
  ReshapeLayerParams* n = new ReshapeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}